

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

UBool __thiscall icu_63::SimpleTimeZone::operator==(SimpleTimeZone *this,TimeZone *that)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  
  if (this == (SimpleTimeZone *)that) {
    return '\x01';
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)
                     (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if ((bVar1) && (UVar2 = TimeZone::operator==((TimeZone *)this,that), UVar2 != '\0')) {
    iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xb])
                      (this,that);
    return (char)iVar3 != '\0';
  }
  return '\0';
}

Assistant:

UBool
SimpleTimeZone::operator==(const TimeZone& that) const
{
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            TimeZone::operator==(that) &&
            hasSameRules(that)));
}